

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

double __thiscall
tetgenmesh::insphere_s(tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double *pe)

{
  int iVar1;
  point pdVar2;
  point pc_00;
  point pd_00;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  point pt [5];
  
  dVar9 = insphere(pa,pb,pc,pd,pe);
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    pt[0] = pa;
    pt[1] = pb;
    pt[2] = pc;
    pt[3] = pd;
    pt[4] = pe;
    iVar1 = this->pointmarkindex;
    lVar4 = 5;
    uVar3 = 0;
    do {
      uVar6 = uVar3;
      lVar4 = lVar4 + -1;
      iVar5 = 0;
      lVar8 = 0;
      while (lVar7 = lVar8, pd_00 = pt[4], pc_00 = pt[3], pdVar2 = pt[2], lVar7 < lVar4) {
        pdVar2 = pt[lVar7];
        lVar8 = lVar7 + 1;
        if (*(int *)((long)pt[lVar7 + 1] + (long)iVar1 * 4) <
            *(int *)((long)pdVar2 + (long)iVar1 * 4)) {
          pt[lVar7] = pt[lVar7 + 1];
          pt[lVar8] = pdVar2;
          iVar5 = iVar5 + 1;
        }
      }
      uVar3 = iVar5 + uVar6;
    } while (iVar5 != 0);
    dVar9 = orient3d(pt[1],pt[2],pt[3],pt[4]);
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      if ((uVar6 & 1) != 0) {
        dVar9 = -dVar9;
      }
    }
    else {
      dVar10 = orient3d(pt[0],pdVar2,pc_00,pd_00);
      dVar9 = -dVar10;
      if ((dVar10 == dVar9) && (!NAN(dVar10) && !NAN(dVar9))) {
        terminatetetgen(this,2);
      }
      if ((uVar6 & 1) != 0) {
        dVar9 = dVar10;
      }
    }
  }
  return dVar9;
}

Assistant:

REAL tetgenmesh::insphere_s(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe)
{
  REAL sign;

  sign = insphere(pa, pb, pc, pd, pe);
  if (sign != 0.0) {
    return sign;
  }

  // Symbolic perturbation.
  point pt[5], swappt;
  REAL oriA, oriB;
  int swaps, count;
  int n, i;

  pt[0] = pa;
  pt[1] = pb;
  pt[2] = pc;
  pt[3] = pd;
  pt[4] = pe;
  
  // Sort the five points such that their indices are in the increasing
  //   order. An optimized bubble sort algorithm is used, i.e., it has
  //   the worst case O(n^2) runtime, but it is usually much faster.
  swaps = 0; // Record the total number of swaps.
  n = 5;
  do {
    count = 0;
    n = n - 1;
    for (i = 0; i < n; i++) {
      if (pointmark(pt[i]) > pointmark(pt[i+1])) {
        swappt = pt[i]; pt[i] = pt[i+1]; pt[i+1] = swappt;
        count++;
      }
    }
    swaps += count;
  } while (count > 0); // Continue if some points are swapped.

  oriA = orient3d(pt[1], pt[2], pt[3], pt[4]);
  if (oriA != 0.0) {
    // Flip the sign if there are odd number of swaps.
    if ((swaps % 2) != 0) oriA = -oriA;
    return oriA;
  }
  
  oriB = -orient3d(pt[0], pt[2], pt[3], pt[4]);
  if (oriB == 0.0) {
    terminatetetgen(this, 2);
  }
  // Flip the sign if there are odd number of swaps.
  if ((swaps % 2) != 0) oriB = -oriB;
  return oriB;
}